

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingDecomposerLib.c
# Opt level: O3

void RDL_deleteData(RDL_data *data)

{
  RDL_BCCGraph *pRVar1;
  ulong uVar2;
  
  pRVar1 = data->bccGraphs;
  if (pRVar1->nof_bcc != 0) {
    uVar2 = 0;
    do {
      RDL_deleteAPSP(data->spiPerBCC[uVar2],pRVar1->bcc_graphs[uVar2]->V);
      RDL_deleteCycleFams(data->CFsPerBCC[uVar2]);
      if (data->nofURFsPerBCC[uVar2] != 0) {
        RDL_deleteURFInfo(data->urfInfoPerBCC[uVar2]);
      }
      uVar2 = uVar2 + 1;
      pRVar1 = data->bccGraphs;
    } while (uVar2 < pRVar1->nof_bcc);
  }
  free(data->spiPerBCC);
  free(data->CFsPerBCC);
  free(data->nofURFsPerBCC);
  free(data->nofRCFsPerBCC);
  free(data->urfInfoPerBCC);
  RDL_deleteBCCGraph(data->bccGraphs);
  free(data->urf_to_bcc);
  free(data->rcf_to_urf);
  RDL_deleteGraph(data->graph);
  free(data);
  return;
}

Assistant:

void RDL_deleteData(RDL_data *data)
{
  unsigned i;

  for (i = 0; i < data->bccGraphs->nof_bcc; ++i) {
    RDL_deleteAPSP(data->spiPerBCC[i], data->bccGraphs->bcc_graphs[i]->V);
    RDL_deleteCycleFams(data->CFsPerBCC[i]);
    if (data->nofURFsPerBCC[i] > 0) {
      RDL_deleteURFInfo(data->urfInfoPerBCC[i]);
    }
  }
  free(data->spiPerBCC);
  free(data->CFsPerBCC);
  free(data->nofURFsPerBCC);
  free(data->nofRCFsPerBCC);
  free(data->urfInfoPerBCC);
  RDL_deleteBCCGraph(data->bccGraphs);
  free(data->urf_to_bcc);
  free(data->rcf_to_urf);

  RDL_deleteGraph(data->graph);
  free(data);
}